

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::ThreadEvent>::copyConstruct
          (BasicTypeInfo<dap::ThreadEvent> *this,void *dst,void *src)

{
  ThreadEvent::ThreadEvent((ThreadEvent *)dst,(ThreadEvent *)src);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }